

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::paintEvent(QTreeView *this,QPaintEvent *event)

{
  int iVar1;
  int iVar2;
  QTreeViewPrivate *this_00;
  QWidgetData *pQVar3;
  uint uVar4;
  QWidget *pQVar5;
  QPaintDevice *pQVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  QPainter painter;
  QRect local_58;
  QRegion local_48;
  QRegion local_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  pQVar6 = &pQVar5->super_QPaintDevice;
  if (pQVar5 == (QWidget *)0x0) {
    pQVar6 = (QPaintDevice *)0x0;
  }
  QPainter::QPainter((QPainter *)&local_38,pQVar6);
  if ((this_00->super_QAbstractItemViewPrivate).state == AnimatingState) {
    pQVar3 = ((this_00->animatedOperation).viewport)->data;
    iVar1 = (pQVar3->crect).y2.m_i;
    uVar7._0_4_ = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
    iVar2 = (pQVar3->crect).y1.m_i;
    uVar4 = QTreeViewPrivate::AnimatedOperation::top(&this_00->animatedOperation);
    local_58._0_8_ = (ulong)uVar4 << 0x20;
    uVar7._4_4_ = (iVar1 - iVar2) + uVar4;
    local_58._8_8_ = uVar7;
    QRegion::QRegion(&local_48,&local_58,Rectangle);
    QRegion::operator-(&local_40,(QRegion *)(event + 0x20));
    drawTree(this,(QPainter *)&local_38,&local_40);
    QRegion::~QRegion(&local_40);
    QRegion::~QRegion(&local_48);
    QTreeViewPrivate::drawAnimatedOperation(this_00,(QPainter *)&local_38);
  }
  else {
    drawTree(this,(QPainter *)&local_38,(QRegion *)(event + 0x20));
    QAbstractItemViewPrivate::paintDropIndicator
              (&this_00->super_QAbstractItemViewPrivate,(QPainter *)&local_38);
  }
  QPainter::~QPainter((QPainter *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::paintEvent(QPaintEvent *event)
{
    Q_D(QTreeView);
    d->executePostedLayout();
    QPainter painter(viewport());
#if QT_CONFIG(animation)
    if (d->isAnimating()) {
        drawTree(&painter, event->region() - d->animatedOperation.rect());
        d->drawAnimatedOperation(&painter);
    } else
#endif // animation
    {
        drawTree(&painter, event->region());
#if QT_CONFIG(draganddrop)
        d->paintDropIndicator(&painter);
#endif
    }
}